

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleUVCols64_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x32,int dx)

{
  int j;
  uint16_t *dst;
  uint16_t *src;
  int64_t x;
  int dx_local;
  int x32_local;
  int dst_width_local;
  uint8_t *src_uv_local;
  uint8_t *dst_uv_local;
  
  x = (int64_t)x32;
  dst = (uint16_t *)dst_uv;
  for (j = 0; j < dst_width + -1; j = j + 2) {
    *dst = *(uint16_t *)(src_uv + (x >> 0x10) * 2);
    dst[1] = *(uint16_t *)(src_uv + (dx + x >> 0x10) * 2);
    x = (long)dx + dx + x;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = *(uint16_t *)(src_uv + (x >> 0x10) * 2);
  }
  return;
}

Assistant:

void ScaleUVCols64_C(uint8_t* dst_uv,
                     const uint8_t* src_uv,
                     int dst_width,
                     int x32,
                     int dx) {
  int64_t x = (int64_t)(x32);
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[0] = src[x >> 16];
    x += dx;
    dst[1] = src[x >> 16];
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[x >> 16];
  }
}